

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

uint64_t roaring_bitmap_and_cardinality(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint16_t *puVar5;
  uint16_t *puVar6;
  int iVar7;
  array_container_t *src_1;
  byte bVar8;
  int iVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  array_container_t *array2;
  array_container_t *paVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint64_t uVar19;
  
  iVar3 = (x1->high_low_container).size;
  iVar4 = (x2->high_low_container).size;
  uVar18 = 0;
  if (iVar4 < 1 || iVar3 < 1) {
    uVar19 = 0;
  }
  else {
    uVar19 = 0;
    uVar17 = 0;
    do {
      puVar5 = (x1->high_low_container).keys;
      uVar14 = uVar18 & 0xffff;
      uVar1 = puVar5[uVar14];
      puVar6 = (x2->high_low_container).keys;
      uVar16 = uVar17 & 0xffff;
      uVar2 = puVar6[uVar16];
      if (uVar1 != uVar2) {
        if (uVar1 < uVar2) {
          uVar16 = (x1->high_low_container).size;
          uVar14 = uVar18 + 1;
          uVar11 = uVar14;
          uVar12 = uVar17;
          if (((int)uVar14 < (int)uVar16) && (puVar5[(int)uVar14] < uVar2)) {
            uVar18 = uVar18 + 2;
            iVar7 = 1;
            if ((int)uVar18 < (int)uVar16) {
              iVar9 = 1;
              do {
                iVar7 = iVar9;
                if (uVar2 <= puVar5[(int)uVar18]) goto LAB_0011d30c;
                iVar7 = iVar9 * 2;
                uVar18 = uVar14 + iVar9 * 2;
                iVar9 = iVar7;
              } while ((int)uVar18 < (int)uVar16);
            }
            uVar18 = uVar16 - 1;
LAB_0011d30c:
            uVar11 = uVar18;
            if (((puVar5[(int)uVar18] != uVar2) && (uVar11 = uVar16, uVar2 <= puVar5[(int)uVar18]))
               && (uVar11 = uVar18, (iVar7 >> 1) + uVar14 + 1 != uVar18)) {
              uVar14 = (iVar7 >> 1) + uVar14;
              do {
                uVar11 = (int)(uVar14 + uVar18) >> 1;
                if (puVar5[(int)uVar11] == uVar2) break;
                if (uVar2 <= puVar5[(int)uVar11]) {
                  uVar18 = uVar11;
                  uVar11 = uVar14;
                }
                uVar14 = uVar11;
                uVar11 = uVar18;
              } while (uVar14 + 1 != uVar18);
            }
          }
        }
        else {
          uVar16 = (x2->high_low_container).size;
          uVar14 = uVar17 + 1;
          uVar11 = uVar18;
          uVar12 = uVar14;
          if (((int)uVar14 < (int)uVar16) && (puVar6[(int)uVar14] < uVar1)) {
            uVar17 = uVar17 + 2;
            iVar7 = 1;
            if ((int)uVar17 < (int)uVar16) {
              iVar9 = 1;
              do {
                iVar7 = iVar9;
                if (uVar1 <= puVar6[(int)uVar17]) goto LAB_0011d373;
                iVar7 = iVar9 * 2;
                uVar17 = uVar14 + iVar9 * 2;
                iVar9 = iVar7;
              } while ((int)uVar17 < (int)uVar16);
            }
            uVar17 = uVar16 - 1;
LAB_0011d373:
            uVar12 = uVar17;
            if (((puVar6[(int)uVar17] != uVar1) && (uVar12 = uVar16, uVar1 <= puVar6[(int)uVar17]))
               && (uVar12 = uVar17, (iVar7 >> 1) + uVar14 + 1 != uVar17)) {
              uVar14 = (iVar7 >> 1) + uVar14;
              do {
                uVar12 = (int)(uVar14 + uVar17) >> 1;
                if (puVar6[(int)uVar12] == uVar1) break;
                if (uVar1 <= puVar6[(int)uVar12]) {
                  uVar17 = uVar12;
                  uVar12 = uVar14;
                }
                uVar14 = uVar12;
                uVar12 = uVar17;
              } while (uVar14 + 1 != uVar17);
            }
          }
        }
        goto LAB_0011d471;
      }
      bVar8 = (x1->high_low_container).typecodes[uVar14];
      src_1 = (array_container_t *)(x1->high_low_container).containers[uVar14];
      bVar10 = (x2->high_low_container).typecodes[uVar16];
      array2 = (array_container_t *)(x2->high_low_container).containers[uVar16];
      if (bVar8 == 4) {
        bVar8 = *(byte *)&src_1->array;
        if (bVar8 == 4) goto LAB_0011d504;
        src_1 = *(array_container_t **)src_1;
      }
      if (bVar10 == 4) {
        bVar10 = *(byte *)&array2->array;
        if (bVar10 == 4) {
LAB_0011d504:
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        array2 = *(array_container_t **)array2;
      }
      switch((uint)bVar10 + (uint)bVar8 * 4) {
      case 5:
        iVar7 = bitset_container_and_justcard
                          ((bitset_container_t *)src_1,(bitset_container_t *)array2);
        break;
      case 6:
        if ((long)array2->cardinality < 1) {
LAB_0011d481:
          iVar7 = 0;
        }
        else {
          lVar15 = 0;
          iVar7 = 0;
          do {
            iVar7 = iVar7 + (uint)((*(ulong *)(src_1->array +
                                              (ulong)(array2->array[lVar15] >> 6) * 4) >>
                                    ((ulong)array2->array[lVar15] & 0x3f) & 1) != 0);
            lVar15 = lVar15 + 1;
          } while (array2->cardinality != lVar15);
        }
        break;
      case 7:
        paVar13 = src_1;
        goto LAB_0011d456;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1369,
                      "int container_and_cardinality(const container_t *, uint8_t, const container_t *, uint8_t)"
                     );
      case 9:
        if ((long)src_1->cardinality < 1) goto LAB_0011d481;
        lVar15 = 0;
        iVar7 = 0;
        do {
          iVar7 = iVar7 + (uint)((*(ulong *)(array2->array + (ulong)(src_1->array[lVar15] >> 6) * 4)
                                  >> ((ulong)src_1->array[lVar15] & 0x3f) & 1) != 0);
          lVar15 = lVar15 + 1;
        } while (src_1->cardinality != lVar15);
        break;
      case 10:
        iVar7 = array_container_intersection_cardinality(src_1,array2);
        break;
      case 0xb:
        paVar13 = array2;
        goto LAB_0011d3cf;
      case 0xd:
        paVar13 = array2;
        array2 = src_1;
LAB_0011d456:
        iVar7 = run_bitset_container_intersection_cardinality
                          ((run_container_t *)array2,(bitset_container_t *)paVar13);
        break;
      case 0xe:
        paVar13 = src_1;
        src_1 = array2;
LAB_0011d3cf:
        iVar7 = array_run_container_intersection_cardinality(src_1,(run_container_t *)paVar13);
        break;
      case 0xf:
        iVar7 = run_container_intersection_cardinality
                          ((run_container_t *)src_1,(run_container_t *)array2);
      }
      uVar19 = uVar19 + (long)iVar7;
      uVar11 = uVar18 + 1;
      uVar12 = uVar17 + 1;
LAB_0011d471:
      uVar17 = uVar12;
      uVar18 = uVar11;
    } while (((int)uVar18 < iVar3) && ((int)uVar17 < iVar4));
  }
  return uVar19;
}

Assistant:

uint64_t roaring_bitmap_and_cardinality(const roaring_bitmap_t *x1,
                                        const roaring_bitmap_t *x2) {
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint64_t answer = 0;
    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
        const uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            answer += container_and_cardinality(c1, type1, c2, type2);
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer;
}